

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall
ImFontGlyphRangesBuilder::BuildRanges
          (ImFontGlyphRangesBuilder *this,ImVector_ImWchar_conflict1 *out_ranges)

{
  wchar_t wVar1;
  ImWchar *pIVar2;
  wchar_t wVar3;
  ulong uVar4;
  wchar_t wVar5;
  uint uVar6;
  uint uVar7;
  
  uVar6 = 0;
  do {
    if (((int)uVar6 >> 5 < 0) || ((this->UsedChars).Size <= (int)uVar6 >> 5)) {
LAB_0020c66a:
      __assert_fail("i >= 0 && i < Size",
                    "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.h"
                    ,0x707,
                    "const T &ImVector<unsigned int>::operator[](int) const [T = unsigned int]");
    }
    uVar7 = uVar6;
    if (((this->UsedChars).Data[uVar6 >> 5] >> (uVar6 & 0x1f) & 1) != 0) {
      wVar3 = out_ranges->Size;
      if (wVar3 == out_ranges->Capacity) {
        if (wVar3 == L'\0') {
          wVar1 = L'\b';
        }
        else {
          wVar1 = wVar3 / 2 + wVar3;
        }
        wVar5 = wVar3 + L'\x01';
        if (wVar3 + L'\x01' < wVar1) {
          wVar5 = wVar1;
        }
        pIVar2 = (ImWchar *)ImGui::MemAlloc((long)wVar5 * 2);
        if (out_ranges->Data != (ImWchar *)0x0) {
          memcpy(pIVar2,out_ranges->Data,(long)out_ranges->Size * 2);
          ImGui::MemFree(out_ranges->Data);
        }
        out_ranges->Data = pIVar2;
        out_ranges->Capacity = wVar5;
        wVar3 = out_ranges->Size;
      }
      else {
        pIVar2 = out_ranges->Data;
      }
      uVar4 = (ulong)uVar6;
      pIVar2[wVar3] = (ImWchar)uVar6;
      wVar1 = out_ranges->Size;
      wVar3 = wVar1 + L'\x01';
      out_ranges->Size = wVar3;
      uVar7 = uVar6 - 1;
      do {
        if (0xfffe < uVar4) {
          uVar7 = 0xffff;
          break;
        }
        uVar4 = uVar4 + 1;
        if ((this->UsedChars).Size <= (int)((uint)(uVar4 >> 5) & 0x7ffffff)) goto LAB_0020c66a;
        uVar7 = uVar7 + 1;
      } while (((this->UsedChars).Data[uVar4 >> 5] >> ((uint)uVar4 & 0x1f) & 1) != 0);
      if (wVar3 == out_ranges->Capacity) {
        if (wVar3 == L'\0') {
          wVar3 = L'\b';
        }
        else {
          wVar3 = wVar3 / 2 + wVar3;
        }
        wVar1 = wVar1 + L'\x02';
        if (wVar1 < wVar3) {
          wVar1 = wVar3;
        }
        pIVar2 = (ImWchar *)ImGui::MemAlloc((long)wVar1 * 2);
        if (out_ranges->Data != (ImWchar *)0x0) {
          memcpy(pIVar2,out_ranges->Data,(long)out_ranges->Size * 2);
          ImGui::MemFree(out_ranges->Data);
        }
        out_ranges->Data = pIVar2;
        out_ranges->Capacity = wVar1;
        wVar3 = out_ranges->Size;
      }
      else {
        pIVar2 = out_ranges->Data;
      }
      pIVar2[wVar3] = (ImWchar)uVar7;
      out_ranges->Size = out_ranges->Size + L'\x01';
    }
    uVar6 = uVar7 + 1;
    if (0xfffe < (int)uVar7) {
      wVar3 = out_ranges->Size;
      if (wVar3 == out_ranges->Capacity) {
        if (wVar3 == L'\0') {
          wVar1 = L'\b';
        }
        else {
          wVar1 = wVar3 / 2 + wVar3;
        }
        wVar5 = wVar3 + L'\x01';
        if (wVar3 + L'\x01' < wVar1) {
          wVar5 = wVar1;
        }
        pIVar2 = (ImWchar *)ImGui::MemAlloc((long)wVar5 * 2);
        if (out_ranges->Data != (ImWchar *)0x0) {
          memcpy(pIVar2,out_ranges->Data,(long)out_ranges->Size * 2);
          ImGui::MemFree(out_ranges->Data);
        }
        out_ranges->Data = pIVar2;
        out_ranges->Capacity = wVar5;
        wVar3 = out_ranges->Size;
      }
      else {
        pIVar2 = out_ranges->Data;
      }
      pIVar2[wVar3] = 0;
      out_ranges->Size = out_ranges->Size + L'\x01';
      return;
    }
  } while( true );
}

Assistant:

void ImFontGlyphRangesBuilder::BuildRanges(ImVector<ImWchar>* out_ranges)
{
    const int max_codepoint = IM_UNICODE_CODEPOINT_MAX;
    for (int n = 0; n <= max_codepoint; n++)
        if (GetBit(n))
        {
            out_ranges->push_back((ImWchar)n);
            while (n < max_codepoint && GetBit(n + 1))
                n++;
            out_ranges->push_back((ImWchar)n);
        }
    out_ranges->push_back(0);
}